

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  int iVar1;
  char *pcVar2;
  cmFunctionBlocker *pcVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference lff_00;
  bool bVar7;
  cmExecutionStatus local_e8;
  uint local_e4;
  cmExecutionStatus status;
  uint c;
  uint i;
  string err;
  undefined1 local_b0 [7];
  bool isTrue;
  cmConditionEvaluator conditionEvaluator;
  MessageType messageType;
  undefined1 local_88 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  undefined1 local_48 [16];
  auto_ptr<cmFunctionBlocker> local_38;
  auto_ptr<cmFunctionBlocker> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmWhileFunctionBlocker *this_local;
  
  fb.x_ = (cmFunctionBlocker *)inStatus;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"while");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"endwhile");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_48,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        local_48._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_48);
        cmsys::auto_ptr<cmFunctionBlocker>::auto_ptr
                  (&local_38,(auto_ptr_ref<cmFunctionBlocker>)local_48._8_8_);
        cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr((auto_ptr<cmFunctionBlocker> *)local_48);
        pcVar3 = cmsys::auto_ptr<cmFunctionBlocker>::get(&local_38);
        if (pcVar3 == (cmFunctionBlocker *)0x0) {
          this_local._7_1_ = 0;
        }
        else {
          std::__cxx11::string::string
                    ((string *)
                     &expandedArguments.
                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
                    ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_88);
          cmMakefile::ExpandArguments
                    (mf,&this->Args,
                     (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_88,(char *)0x0);
          cmConditionEvaluator::cmConditionEvaluator((cmConditionEvaluator *)local_b0,mf);
          err.field_2._M_local_buf[0xf] =
               cmConditionEvaluator::IsTrue
                         ((cmConditionEvaluator *)local_b0,
                          (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           *)local_88,
                          (string *)
                          &expandedArguments.
                           super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          &conditionEvaluator.Policy57Status);
          while (err.field_2._M_local_buf[0xf] != '\0') {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&i,"had incorrect arguments: ",(allocator *)((long)&c + 3));
              std::allocator<char>::~allocator((allocator<char> *)((long)&c + 3));
              status.ReturnInvoked = false;
              status.BreakInvoked = false;
              status.ContinueInvoked = false;
              status.NestedError = false;
              for (; uVar4 = (ulong)(uint)status,
                  sVar5 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size
                                    (&this->Args), uVar4 < sVar5;
                  status = (cmExecutionStatus)((int)status + 1)) {
                pvVar6 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                pcVar2 = "";
                if (pvVar6->Delim != Unquoted) {
                  pcVar2 = "\"";
                }
                std::__cxx11::string::operator+=((string *)&i,pcVar2);
                pvVar6 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                std::__cxx11::string::operator+=((string *)&i,(string *)pvVar6);
                pvVar6 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                pcVar2 = "";
                if (pvVar6->Delim != Unquoted) {
                  pcVar2 = "\"";
                }
                std::__cxx11::string::operator+=((string *)&i,pcVar2);
                std::__cxx11::string::operator+=((string *)&i," ");
              }
              std::__cxx11::string::operator+=((string *)&i,"(");
              std::__cxx11::string::operator+=
                        ((string *)&i,
                         (string *)
                         &expandedArguments.
                          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator+=((string *)&i,").");
              cmMakefile::IssueMessage(mf,conditionEvaluator.Policy57Status,(string *)&i);
              bVar7 = conditionEvaluator.Policy57Status == WARN;
              if (bVar7) {
                cmSystemTools::SetFatalErrorOccured();
                this_local._7_1_ = 1;
              }
              std::__cxx11::string::~string((string *)&i);
              if (bVar7) goto LAB_0062d641;
            }
            for (local_e4 = 0; uVar4 = (ulong)local_e4,
                sVar5 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                                  (&this->Functions), uVar4 < sVar5; local_e4 = local_e4 + 1) {
              cmExecutionStatus::cmExecutionStatus(&local_e8);
              lff_00 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                       operator[](&this->Functions,(ulong)local_e4);
              cmMakefile::ExecuteCommand(mf,lff_00,&local_e8);
              bVar7 = cmExecutionStatus::GetReturnInvoked(&local_e8);
              if (bVar7) {
                cmExecutionStatus::SetReturnInvoked((cmExecutionStatus *)fb.x_,true);
                this_local._7_1_ = 1;
                goto LAB_0062d641;
              }
              bVar7 = cmExecutionStatus::GetBreakInvoked(&local_e8);
              if (bVar7) {
                this_local._7_1_ = 1;
                goto LAB_0062d641;
              }
              bVar7 = cmExecutionStatus::GetContinueInvoked(&local_e8);
              if (bVar7) break;
              bVar7 = cmSystemTools::GetFatalErrorOccured();
              if (bVar7) {
                this_local._7_1_ = 1;
                goto LAB_0062d641;
              }
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            clear((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_88);
            cmMakefile::ExpandArguments
                      (mf,&this->Args,
                       (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)local_88,(char *)0x0);
            err.field_2._M_local_buf[0xf] =
                 cmConditionEvaluator::IsTrue
                           ((cmConditionEvaluator *)local_b0,
                            (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             *)local_88,
                            (string *)
                            &expandedArguments.
                             super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            &conditionEvaluator.Policy57Status);
          }
          this_local._7_1_ = 1;
LAB_0062d641:
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_88);
          std::__cxx11::string::~string
                    ((string *)
                     &expandedArguments.
                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr(&local_38);
        goto LAB_0062d6af;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  this_local._7_1_ = 1;
LAB_0062d6af:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmWhileFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"while"))
    {
    // record the number of while commands past this one
    this->Depth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endwhile"))
    {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmConditionEvaluator conditionEvaluator(mf);

      bool isTrue = conditionEvaluator.IsTrue(
        expandedArguments, errorString, messageType);

      while (isTrue)
        {
        if (!errorString.empty())
          {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for(i =0; i < this->Args.size(); ++i)
            {
            err += (this->Args[i].Delim?"\"":"");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim?"\"":"");
            err += " ";
            }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR)
            {
            cmSystemTools::SetFatalErrorOccured();
            return true;
            }
          }

        // Invoke all the functions that were collected in the block.
        for(unsigned int c = 0; c < this->Functions.size(); ++c)
          {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            return true;
            }
          if (status.GetContinueInvoked())
            {
            break;
            }
          if(cmSystemTools::GetFatalErrorOccured() )
            {
            return true;
            }
          }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(
          expandedArguments, errorString, messageType);
        }
      return true;
      }
    else
      {
      // decrement for each nested while that ends
      this->Depth--;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}